

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void Action_add(action **app,e_action type,symbol *sp,char *arg)

{
  action **ppaVar1;
  action *__s;
  action *paVar2;
  long lVar3;
  
  if (Action_new_actionfreelist == (action *)0x0) {
    __s = (action *)lemon_malloc(4000);
    memset(__s,0,4000);
    lVar3 = 99;
    paVar2 = __s;
    Action_new_actionfreelist = __s;
    do {
      paVar2->next = paVar2 + 1;
      lVar3 = lVar3 + -1;
      paVar2 = paVar2 + 1;
    } while (lVar3 != 0);
    __s[99].next = (action *)0x0;
  }
  paVar2 = Action_new_actionfreelist;
  ppaVar1 = &Action_new_actionfreelist->next;
  Action_new_actionfreelist = Action_new_actionfreelist->next;
  *ppaVar1 = *app;
  *app = paVar2;
  paVar2->type = type;
  paVar2->sp = sp;
  paVar2->spOpt = (symbol *)0x0;
  (paVar2->x).stp = (state *)arg;
  return;
}

Assistant:

void Action_add(
  struct action **app,
  enum e_action type,
  struct symbol *sp,
  char *arg
){
  struct action *newaction;
  newaction = Action_new();
  newaction->next = *app;
  *app = newaction;
  newaction->type = type;
  newaction->sp = sp;
  newaction->spOpt = 0;
  if( type==SHIFT ){
    newaction->x.stp = (struct state *)arg;
  }else{
    newaction->x.rp = (struct rule *)arg;
  }
}